

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

bool goodform::json::parse_object(istream *input,any *v)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  *this;
  mapped_type *this_00;
  byte bVar4;
  any value;
  string key;
  any local_78;
  undefined1 local_68 [32];
  _Base_ptr local_48;
  size_t local_40;
  
  local_68._24_8_ = local_68 + 8;
  local_68._0_8_ = (pointer)0x0;
  local_68._8_8_ = 0;
  local_68._16_8_ = (_Base_ptr)0x0;
  local_40 = 0;
  local_48 = (_Base_ptr)local_68._24_8_;
  std::any::operator=(v,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                         *)local_68);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
               *)local_68);
  cVar1 = std::istream::get();
  if (cVar1 == '{') {
    do {
      if (*(int *)(input + *(long *)(*(long *)input + -0x18) + 0x20) != 0) goto LAB_001304d0;
      strip_white_space(input);
      iVar3 = std::istream::peek();
      if (iVar3 == 0x7d) {
        std::istream::seekg((long)input,_S_cur);
        return true;
      }
      local_68._8_8_ = 0;
      local_68._16_8_ = local_68._16_8_ & 0xffffffffffffff00;
      local_68._0_8_ = local_68 + 0x10;
      bVar2 = read_string(input,(string *)local_68);
      bVar4 = 1;
      if (bVar2) {
        strip_white_space(input);
        iVar3 = std::istream::peek();
        if (iVar3 != 0x3a) goto LAB_0013048f;
        std::istream::seekg((long)input,_S_cur);
        strip_white_space(input);
        local_78._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
        local_78._M_storage._M_ptr = (void *)0x0;
        bVar2 = deserialize(input,&local_78);
        this = get<std::map<std::__cxx11::string,std::any,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::any>>>>
                         (v);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                  ::operator[](this,(string *)local_68);
        std::any::operator=(this_00,&local_78);
        bVar4 = 1;
        if (bVar2) {
          strip_white_space(input);
          iVar3 = std::istream::peek();
          iVar3 = iVar3 << 0x18;
          if ((iVar3 != 0x7d000000) && (iVar3 != 0x2c000000)) goto LAB_001304b7;
          bVar2 = iVar3 == 0x7d000000;
          std::istream::seekg((long)input,_S_cur);
          bVar4 = 0;
        }
        else {
LAB_001304b7:
          bVar2 = false;
        }
        if (local_78._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
          (*local_78._M_manager)(_Op_destroy,&local_78,(_Arg *)0x0);
        }
      }
      else {
LAB_0013048f:
        bVar2 = false;
      }
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,(ulong)(local_68._16_8_ + 1));
      }
    } while ((bVar4 | bVar2) != 1);
  }
  else {
LAB_001304d0:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool json::parse_object(std::istream& input, any& v)
  {
    v = object_t();
    char c = (char)input.get();
    bool closingBraceFound = false;
    if (c == '{')
    {
      bool parseError = false;
      while(!closingBraceFound && !parseError && input.good())
      {
        strip_white_space(input);
        if ((closingBraceFound = (input.peek() == '}')))
        {
          input.seekg(1, std::ios::cur);
        }
        else
        {
          std::string key;
          if (!(parseError = !read_string(input, key)))
          {
            strip_white_space(input);
            if (!(parseError = (input.peek() != ':')))
            {
              input.seekg(1, std::ios::cur);
              strip_white_space(input);

              any value;
              parseError = !deserialize(input, value);
              get<object_t>(v)[key] = std::move(value);

              if (!parseError)
              {
                strip_white_space(input);
                c = (char)input.peek();
                if ((closingBraceFound = (c == '}')) || !(parseError = (c != ',')))
                  input.seekg(1, std::ios::cur);
              }
            }
          }
        }
      }
    }
    return closingBraceFound;
  }